

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O3

void __thiscall
LZ77Compressor::compress_helper<LZ77Compressor::DefaultEncode>
          (LZ77Compressor *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out,
          Item *items,int len,DefaultEncode *encode)

{
  pointer *ppuVar1;
  iterator __position;
  byte bVar2;
  ulong uVar3;
  Item item;
  Item *pIVar4;
  long lVar5;
  uchar local_31;
  
  if (len < 1) {
    bVar2 = 0;
  }
  else {
    uVar3 = 0;
    bVar2 = 0;
    pIVar4 = items;
    do {
      bVar2 = bVar2 | pIVar4->isRepeat << ((byte)uVar3 & 0x1f);
      uVar3 = uVar3 + 1;
      pIVar4 = pIVar4 + 1;
    } while ((uint)len != uVar3);
  }
  __position._M_current =
       (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_realloc_insert<unsigned_char_const&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)out,__position,&local_31);
  }
  else {
    *__position._M_current = bVar2;
    ppuVar1 = &(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  if (0 < len) {
    lVar5 = 0;
    do {
      item.field_1.field_1.offset = *(undefined2 *)((long)&items->field_1 + lVar5 + 2);
      item._0_4_ = *(undefined4 *)(&items->isRepeat + lVar5);
      DefaultEncode::operator()(encode,out,item);
      lVar5 = lVar5 + 6;
    } while ((ulong)(uint)len * 6 != lVar5);
  }
  return;
}

Assistant:

void compress_helper(std::vector<uint8_t>& out, const Item* items, int len, Fn& encode) {
		uint8_t control = 0;
		for (int i = 0; i < len; i++) {
			control |= ((items[i].isRepeat ? 1 : 0) << i);
		}
		out.push_back(control);
		for (int i = 0; i < len; i++) {
			encode(out, items[i]);
		}
	}